

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_RoundWindPair_Test::~TEST_MinipointCounterTest_RoundWindPair_Test
          (TEST_MinipointCounterTest_RoundWindPair_Test *this)

{
  TEST_MinipointCounterTest_RoundWindPair_Test *mem;
  TEST_MinipointCounterTest_RoundWindPair_Test *this_local;
  
  mem = this;
  ~TEST_MinipointCounterTest_RoundWindPair_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(MinipointCounterTest, RoundWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::EastWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(22, m.total(false));
}